

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

bool __thiscall
Rml::PropertySpecification::ParseShorthandDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,ShorthandId shorthand_id,
          String *property_value)

{
  int iVar1;
  pointer pSVar2;
  PropertyDefinition *this_00;
  pointer pSVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  PropertyId id;
  ShorthandType SVar8;
  ShorthandDefinition *pSVar9;
  const_iterator __last;
  long lVar10;
  ulong uVar11;
  pointer pSVar12;
  size_t i;
  ulong uVar13;
  allocator<char> local_109;
  StringList property_values;
  allocator<char> local_e1;
  ShorthandDefinition *local_e0;
  PropertySpecification *local_d8;
  ulong local_d0;
  String local_c8;
  String *local_a0;
  PropertyDictionary *local_98;
  Property new_property;
  
  local_d8 = this;
  pSVar9 = GetShorthand(this,shorthand_id);
  if (pSVar9 == (ShorthandDefinition *)0x0) {
    return false;
  }
  property_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  property_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  property_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParsePropertyValues(this,&property_values,property_value,
                      (pSVar9->type == RecursiveCommaSeparated) + Whitespace);
  if (property_values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      property_values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002bb814;
  SVar8 = pSVar9->type;
  if (SVar8 == Flex) {
    if (((long)(pSVar9->items).
               super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pSVar9->items).
               super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl.
               super__Vector_impl_data._M_start != 0x30) &&
       (bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->items.size() == 3)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                       ,0x118), !bVar5)) goto LAB_002bb834;
    bVar5 = ::std::operator==(property_values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"none");
    if (bVar5) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&new_property,"0",(allocator<char> *)&local_c8);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)(new_property.value.data + 0x18),"0",&local_109);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&new_property.source,"auto",&local_e1);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &property_values,&new_property,&stack0xffffffffffffffd0);
      lVar10 = 0x40;
      do {
        ::std::__cxx11::string::~string((string *)(new_property.value.data + lVar10 + -8));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
    }
    else {
      local_e0 = pSVar9;
      local_a0 = property_value;
      Property::Property(&new_property);
      bVar6 = 1;
      local_98 = dictionary;
      for (lVar10 = 0; property_value = local_a0, pSVar9 = local_e0, lVar10 != 0xc;
          lVar10 = lVar10 + 4) {
        local_d0 = CONCAT71(local_d0._1_7_,bVar6);
        pSVar2 = (local_e0->items).
                 super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl
                 .super__Vector_impl_data._M_start;
        this_00 = *(PropertyDefinition **)((long)&pSVar2->field_4 + lVar10 * 4);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   (char *)((long)&DAT_00323a48 + (long)*(int *)((long)&DAT_00323a48 + lVar10)),
                   &local_109);
        bVar5 = PropertyDefinition::ParseValue(this_00,&new_property,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        dictionary = local_98;
        PropertyDictionary::SetProperty
                  (local_98,(&pSVar2->field_3)[lVar10 * 4].property_id,&new_property);
        bVar6 = (byte)local_d0 & bVar5;
      }
      if ((bVar6 == 0) &&
         (bVar5 = Assert("RMLUI_ASSERT(result)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                         ,299), !bVar5)) goto LAB_002bb834;
      Property::~Property(&new_property);
    }
    SVar8 = pSVar9->type;
  }
  switch(SVar8) {
  case FallThrough:
  case Replicate:
  case Flex:
    goto switchD_002bb3a3_caseD_0;
  case Box:
    uVar13 = (long)property_values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)property_values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (3 < uVar13) goto switchD_002bb3a3_caseD_0;
    local_c8._M_dataplus._M_p._0_4_ = 0;
    local_c8._M_dataplus._M_p._4_4_ = 0;
    local_c8._M_string_length._0_4_ = 0;
    local_c8._M_string_length._4_4_ = 0;
    if (uVar13 == 3) {
      local_c8._M_dataplus._M_p._4_4_ = 1;
      local_c8._M_string_length._0_4_ = 2;
      local_c8._M_string_length._4_4_ = 1;
    }
    else if (uVar13 == 2) {
      local_c8._M_dataplus._M_p._4_4_ = 1;
      local_c8._M_string_length._4_4_ = local_c8._M_dataplus._M_p._4_4_;
    }
    else if (uVar13 == 1) {
      local_c8._M_dataplus._M_p._0_4_ = 0;
      local_c8._M_dataplus._M_p._4_4_ = 0;
      local_c8._M_string_length._0_4_ = 0;
      local_c8._M_string_length._4_4_ = 0;
    }
    else {
      bVar5 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                     ,0x144);
      if (!bVar5) goto LAB_002bb834;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
      if (((&((pSVar9->items).
              super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl.
              super__Vector_impl_data._M_start)->type)[lVar10] != Property) &&
         (bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property)"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                         ,0x149), !bVar5)) goto LAB_002bb834;
      Property::Property(&new_property);
      bVar5 = PropertyDefinition::ParseValue
                        (*(PropertyDefinition **)
                          ((long)&((pSVar9->items).
                                   super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_4 + lVar10 * 4)
                         ,&new_property,
                         property_values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         *(int *)((long)&local_c8._M_dataplus._M_p + lVar10));
      if (!bVar5) goto LAB_002bb807;
      id = PropertyDefinition::GetId
                     (*(PropertyDefinition **)
                       ((long)&((pSVar9->items).
                                super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_4 + lVar10 * 4));
      PropertyDictionary::SetProperty(dictionary,id,&new_property);
      Property::~Property(&new_property);
    }
    goto LAB_002bb710;
  case RecursiveRepeat:
    bVar6 = 1;
    lVar10 = 6;
    for (uVar13 = 0;
        pSVar2 = (pSVar9->items).
                 super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar13 < (ulong)((long)(pSVar9->items).
                               super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4);
        uVar13 = uVar13 + 1) {
      iVar1 = *(int *)((long)pSVar2 + lVar10 + -6);
      if (iVar1 == 2) {
        bVar5 = ParseShorthandDeclaration
                          (local_d8,dictionary,*(ShorthandId *)((long)&pSVar2->type + lVar10),
                           property_value);
LAB_002bb6e4:
        bVar6 = bVar5 & bVar6 != 0;
      }
      else {
        if (iVar1 == 1) {
          bVar5 = ParsePropertyDeclaration
                            (local_d8,dictionary,*(PropertyId *)((long)&pSVar2->type + lVar10),
                             property_value);
          goto LAB_002bb6e4;
        }
        bVar6 = 0;
      }
      lVar10 = lVar10 + 0x10;
    }
    if (bVar6 != 0) goto LAB_002bb710;
    break;
  case RecursiveCommaSeparated:
    pSVar3 = (pSVar9->items).
             super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar10 = 0;
    pSVar2 = (pSVar9->items).
             super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pSVar12 = pSVar2; pSVar12 != pSVar3; pSVar12 = pSVar12 + 1) {
      lVar10 = lVar10 + (ulong)pSVar12->optional;
    }
    if ((ulong)((long)pSVar3 - (long)pSVar2 >> 4) <=
        (ulong)(((long)property_values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)property_values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) + lVar10)) {
      new_property.value.type = (Type)(new_property.value.data + 8);
      new_property.value.data[0] = '\0';
      new_property.value.data[1] = '\0';
      new_property.value.data[2] = '\0';
      new_property.value.data[3] = '\0';
      new_property.value.data[4] = '\0';
      new_property.value.data[5] = '\0';
      new_property.value.data[6] = '\0';
      new_property.value.data[7] = '\0';
      new_property.value.data[8] = '\0';
      lVar10 = 6;
      local_e0 = (ShorthandDefinition *)0xffffffffffffffff;
      uVar13 = 0;
      do {
        pSVar2 = (pSVar9->items).
                 super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_e0 = (ShorthandDefinition *)&local_e0->field_0x1;
        bVar5 = true;
        if (((undefined1 *)
             ((long)(pSVar9->items).
                    super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4) <= local_e0) ||
           ((ulong)((long)property_values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)property_values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13)) break;
        __last._M_current =
             property_values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar13;
        local_d0 = uVar13;
        if (*(char *)((long)pSVar2 + lVar10 + -1) == '\x01') {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&property_values,
                  (const_iterator)
                  property_values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,__last);
          new_property.value.data[0] = '\0';
          new_property.value.data[1] = '\0';
          new_property.value.data[2] = '\0';
          new_property.value.data[3] = '\0';
          new_property.value.data[4] = '\0';
          new_property.value.data[5] = '\0';
          new_property.value.data[6] = '\0';
          new_property.value.data[7] = '\0';
          *(undefined1 *)new_property.value.type = 0;
          StringUtilities::JoinString((String *)&new_property,&property_values,',');
          __last._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_property;
        }
        iVar1 = *(int *)((long)pSVar2 + lVar10 + -6);
        if (iVar1 == 1) {
          bVar7 = ParsePropertyDeclaration
                            (local_d8,dictionary,*(PropertyId *)((long)&pSVar2->type + lVar10),
                             __last._M_current);
LAB_002bb521:
          bVar6 = *(byte *)((long)pSVar2 + lVar10 + -1);
          if (bVar7 == false) goto LAB_002bb536;
          local_d0 = local_d0 + 1;
        }
        else {
          if (iVar1 == 2) {
            bVar7 = ParseShorthandDeclaration
                              (local_d8,dictionary,*(ShorthandId *)((long)&pSVar2->type + lVar10),
                               __last._M_current);
            goto LAB_002bb521;
          }
          bVar6 = *(byte *)((long)pSVar2 + lVar10 + -1);
LAB_002bb536:
          if (((bVar6 & 1) != 0) || (*(char *)((long)pSVar2 + lVar10 + -2) != '\x01')) {
            bVar5 = false;
            break;
          }
        }
        lVar10 = lVar10 + 0x10;
        uVar13 = local_d0;
      } while ((bVar6 & 1) == 0);
      ::std::__cxx11::string::~string((string *)&new_property);
      goto LAB_002bb816;
    }
    break;
  default:
    bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                   ,0x193);
    if (!bVar5) {
LAB_002bb834:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
switchD_002bb3a3_caseD_0:
    if ((ulong)((long)property_values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)property_values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <=
        (ulong)((long)(pSVar9->items).
                      super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar9->items).
                      super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4)) {
      uVar13 = 1;
      lVar10 = 0;
      uVar11 = 0;
      while (uVar11 < (ulong)((long)property_values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)property_values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        if ((ulong)((long)(pSVar9->items).
                          super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pSVar9->items).
                          super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar13 - 1) {
          if (pSVar9->type != Replicate) goto LAB_002bb814;
          break;
        }
        Property::Property(&new_property);
        bVar5 = PropertyDefinition::ParseValue
                          (*(PropertyDefinition **)
                            ((long)&((pSVar9->items).
                                     super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->field_4 + lVar10),
                           &new_property,
                           property_values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
        if (bVar5) {
          PropertyDictionary::SetProperty
                    (dictionary,
                     (&((pSVar9->items).
                        super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>.
                        _M_impl.super__Vector_impl_data._M_start)->field_3)[lVar10].property_id,
                     &new_property);
          if ((pSVar9->type != Replicate) ||
             (uVar11 < ((long)property_values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)property_values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            uVar11 = uVar11 + 1;
          }
        }
        else if (((pSVar9->type != Flex) && (pSVar9->type != FallThrough)) ||
                ((ulong)((long)(pSVar9->items).
                               super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar9->items).
                               super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar13))
        goto LAB_002bb807;
        Property::~Property(&new_property);
        lVar10 = lVar10 + 0x10;
        uVar13 = uVar13 + 1;
      }
LAB_002bb710:
      bVar5 = true;
      goto LAB_002bb816;
    }
  }
LAB_002bb814:
  bVar5 = false;
LAB_002bb816:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&property_values);
  return bVar5;
LAB_002bb807:
  Property::~Property(&new_property);
  goto LAB_002bb814;
}

Assistant:

bool PropertySpecification::ParseShorthandDeclaration(PropertyDictionary& dictionary, ShorthandId shorthand_id, const String& property_value) const
{
	const ShorthandDefinition* shorthand_definition = GetShorthand(shorthand_id);
	if (!shorthand_definition)
		return false;

	const SplitOption split_option =
		(shorthand_definition->type == ShorthandType::RecursiveCommaSeparated ? SplitOption::Comma : SplitOption::Whitespace);

	StringList property_values;
	ParsePropertyValues(property_values, property_value, split_option);
	if (property_values.empty())
		return false;

	// Handle the special behavior of the flex shorthand first, otherwise it acts like 'FallThrough'.
	if (shorthand_definition->type == ShorthandType::Flex && !property_values.empty())
	{
		RMLUI_ASSERT(shorthand_definition->items.size() == 3);
		if (property_values[0] == "none")
		{
			property_values = {"0", "0", "auto"};
		}
		else
		{
			// Default values when omitted from the 'flex' shorthand is specified here. These defaults are special
			// for this shorthand only, otherwise each underlying property has a different default value.
			const char* default_omitted_values[] = {"1", "1", "0"}; // flex-grow, flex-shrink, flex-basis
			Property new_property;
			bool result = true;
			for (int i = 0; i < 3; i++)
			{
				auto& item = shorthand_definition->items[i];
				result &= item.property_definition->ParseValue(new_property, default_omitted_values[i]);
				dictionary.SetProperty(item.property_id, new_property);
			}
			(void)result;
			RMLUI_ASSERT(result);
		}
	}

	// If this definition is a 'box'-style shorthand (x-top x-right x-bottom x-left) that needs replication.
	if (shorthand_definition->type == ShorthandType::Box && property_values.size() < 4)
	{
		// This array tells which property index each side is parsed from
		Array<int, 4> box_side_to_value_index = {0, 0, 0, 0};
		switch (property_values.size())
		{
		case 1:
			// Only one value is defined, so it is parsed onto all four sides.
			box_side_to_value_index = {0, 0, 0, 0};
			break;
		case 2:
			// Two values are defined, so the first one is parsed onto the top and bottom value, the second onto
			// the left and right.
			box_side_to_value_index = {0, 1, 0, 1};
			break;
		case 3:
			// Three values are defined, so the first is parsed into the top value, the second onto the left and
			// right, and the third onto the bottom.
			box_side_to_value_index = {0, 1, 2, 1};
			break;
		default: RMLUI_ERROR; break;
		}

		for (int i = 0; i < 4; i++)
		{
			RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property);
			Property new_property;
			int value_index = box_side_to_value_index[i];
			if (!shorthand_definition->items[i].property_definition->ParseValue(new_property, property_values[value_index]))
				return false;

			dictionary.SetProperty(shorthand_definition->items[i].property_definition->GetId(), new_property);
		}
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveRepeat)
	{
		bool result = true;

		for (size_t i = 0; i < shorthand_definition->items.size(); i++)
		{
			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.type == ShorthandItemType::Property)
				result &= ParsePropertyDeclaration(dictionary, item.property_id, property_value);
			else if (item.type == ShorthandItemType::Shorthand)
				result &= ParseShorthandDeclaration(dictionary, item.shorthand_id, property_value);
			else
				result = false;
		}

		if (!result)
			return false;
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveCommaSeparated)
	{
		size_t num_optional = 0;
		for (auto& item : shorthand_definition->items)
			if (item.optional)
				num_optional += 1;

		if (property_values.size() + num_optional < shorthand_definition->items.size())
		{
			// Not enough subvalues declared.
			return false;
		}

		size_t subvalue_i = 0;
		String temp_subvalue;
		for (size_t i = 0; i < shorthand_definition->items.size() && subvalue_i < property_values.size(); i++)
		{
			bool result = false;

			const String* subvalue = &property_values[subvalue_i];

			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.repeats)
			{
				property_values.erase(property_values.begin(), property_values.begin() + subvalue_i);
				temp_subvalue.clear();
				StringUtilities::JoinString(temp_subvalue, property_values);
				subvalue = &temp_subvalue;
			}

			if (item.type == ShorthandItemType::Property)
				result = ParsePropertyDeclaration(dictionary, item.property_id, *subvalue);
			else if (item.type == ShorthandItemType::Shorthand)
				result = ParseShorthandDeclaration(dictionary, item.shorthand_id, *subvalue);

			if (result)
				subvalue_i += 1;
			else if (item.repeats || !item.optional)
				return false;

			if (item.repeats)
				break;
		}
	}
	else
	{
		RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough ||
			shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex);

		// Abort over-specified shorthand values.
		if (property_values.size() > shorthand_definition->items.size())
			return false;

		size_t value_index = 0;
		size_t property_index = 0;

		for (; value_index < property_values.size() && property_index < shorthand_definition->items.size(); property_index++)
		{
			Property new_property;

			if (!shorthand_definition->items[property_index].property_definition->ParseValue(new_property, property_values[value_index]))
			{
				// This definition failed to parse; if we're falling through, try the next property. If there is no
				// next property, then abort!
				if (shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Flex)
				{
					if (property_index + 1 < shorthand_definition->items.size())
						continue;
				}
				return false;
			}

			dictionary.SetProperty(shorthand_definition->items[property_index].property_id, new_property);

			// Increment the value index, unless we're replicating the last value and we're up to the last value.
			if (shorthand_definition->type != ShorthandType::Replicate || value_index < property_values.size() - 1)
				value_index++;
		}

		// Abort if we still have values left to parse but no more properties to pass them to.
		if (shorthand_definition->type != ShorthandType::Replicate && value_index < property_values.size() &&
			property_index >= shorthand_definition->items.size())
			return false;
	}

	return true;
}